

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall duckdb::ColumnReader::PreparePageV2(ColumnReader *this,PageHeader *page_hdr)

{
  type codec;
  ParquetReader *pPVar1;
  TProtocol *pTVar2;
  data_ptr_t src;
  ResizeableBuffer *pRVar3;
  runtime_error *this_00;
  ColumnReader *this_01;
  uint buffer_size;
  uint32_t buffer_size_00;
  long lVar4;
  ResizeableBuffer compressed_buffer;
  ResizeableBuffer local_68;
  
  AllocateBlock(this,(long)page_hdr->uncompressed_page_size + 1);
  if ((this->chunk->meta_data).codec == UNCOMPRESSED) {
    if (page_hdr->compressed_page_size == page_hdr->uncompressed_page_size) goto LAB_0023a6f9;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Page size mismatch");
  }
  else {
    if ((((byte)(page_hdr->data_page_header_v2).__isset & 1) != 0) &&
       (((page_hdr->data_page_header_v2).is_compressed & 1U) == 0)) {
LAB_0023a6f9:
      pPVar1 = this->reader;
      pTVar2 = this->protocol;
      pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      ParquetReader::ReadData
                (pPVar1,pTVar2,(pRVar3->super_ByteBuffer).ptr,page_hdr->compressed_page_size);
      return;
    }
    lVar4 = (long)(page_hdr->data_page_header_v2).definition_levels_byte_length +
            (long)(page_hdr->data_page_header_v2).repetition_levels_byte_length;
    buffer_size_00 = (uint32_t)lVar4;
    if ((int)buffer_size_00 <= page_hdr->uncompressed_page_size) {
      pPVar1 = this->reader;
      pTVar2 = this->protocol;
      this_01 = (ColumnReader *)&this->block;
      pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                         ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_01);
      ParquetReader::ReadData(pPVar1,pTVar2,(pRVar3->super_ByteBuffer).ptr,buffer_size_00);
      buffer_size = page_hdr->compressed_page_size - buffer_size_00;
      if (buffer_size != 0 && (int)buffer_size_00 <= page_hdr->compressed_page_size) {
        local_68.super_ByteBuffer.ptr = (data_ptr_t)0x0;
        local_68.super_ByteBuffer.len = 0;
        duckdb::AllocatedData::AllocatedData(&local_68.allocated_data);
        local_68.alloc_len = 0;
        ResizeableBuffer::resize(&local_68,this->reader->allocator,(ulong)buffer_size);
        ParquetReader::ReadData
                  (this->reader,this->protocol,local_68.super_ByteBuffer.ptr,buffer_size);
        src = local_68.super_ByteBuffer.ptr;
        codec = (this->chunk->meta_data).codec;
        pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                           ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_01);
        DecompressInternal(this_01,codec,src,(ulong)buffer_size,
                           (pRVar3->super_ByteBuffer).ptr + lVar4,
                           (long)page_hdr->uncompressed_page_size - (long)(int)buffer_size_00);
        duckdb::AllocatedData::~AllocatedData(&local_68.allocated_data);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Page header inconsistency, uncompressed_page_size needs to be larger than repetition_levels_byte_length + definition_levels_byte_length"
              );
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::PreparePageV2(PageHeader &page_hdr) {
	D_ASSERT(page_hdr.type == PageType::DATA_PAGE_V2);

	AllocateBlock(page_hdr.uncompressed_page_size + 1);
	bool uncompressed = false;
	if (page_hdr.data_page_header_v2.__isset.is_compressed && !page_hdr.data_page_header_v2.is_compressed) {
		uncompressed = true;
	}
	if (chunk->meta_data.codec == CompressionCodec::UNCOMPRESSED) {
		if (page_hdr.compressed_page_size != page_hdr.uncompressed_page_size) {
			throw std::runtime_error("Page size mismatch");
		}
		uncompressed = true;
	}
	if (uncompressed) {
		reader.ReadData(*protocol, block->ptr, page_hdr.compressed_page_size);
		return;
	}

	// copy repeats & defines as-is because FOR SOME REASON they are uncompressed
	auto uncompressed_bytes = page_hdr.data_page_header_v2.repetition_levels_byte_length +
	                          page_hdr.data_page_header_v2.definition_levels_byte_length;
	if (uncompressed_bytes > page_hdr.uncompressed_page_size) {
		throw std::runtime_error("Page header inconsistency, uncompressed_page_size needs to be larger than "
		                         "repetition_levels_byte_length + definition_levels_byte_length");
	}
	reader.ReadData(*protocol, block->ptr, uncompressed_bytes);

	auto compressed_bytes = page_hdr.compressed_page_size - uncompressed_bytes;

	if (compressed_bytes > 0) {
		ResizeableBuffer compressed_buffer;
		compressed_buffer.resize(GetAllocator(), compressed_bytes);
		reader.ReadData(*protocol, compressed_buffer.ptr, compressed_bytes);

		DecompressInternal(chunk->meta_data.codec, compressed_buffer.ptr, compressed_bytes,
		                   block->ptr + uncompressed_bytes, page_hdr.uncompressed_page_size - uncompressed_bytes);
	}
}